

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceSurface::~IfcFaceSurface(IfcFaceSurface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFaceSurface_00871a08;
  *(undefined ***)&this->field_0x80 = &PTR__IfcFaceSurface_00871aa8;
  *(undefined ***)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcFaceSurface_00871a30;
  *(undefined ***)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcFaceSurface_00871a58;
  *(undefined ***)&(this->super_IfcFace).field_0x48 = &PTR__IfcFaceSurface_00871a80;
  pcVar2 = (this->SameSense)._M_dataplus._M_p;
  paVar1 = &(this->SameSense).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x871b80;
  *(undefined8 *)&this->field_0x80 = 0x871bf8;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x871ba8;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x871bd0;
  pvVar3 = *(void **)&(this->super_IfcFace).super_IfcTopologicalRepresentationItem.field_0x30;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&(this->super_IfcFace).field_0x40 - (long)pvVar3);
  }
  operator_delete(this,0x98);
  return;
}

Assistant:

IfcFaceSurface() : Object("IfcFaceSurface") {}